

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool __thiscall
testing::internal::FloatingPoint<float>::AlmostEquals
          (FloatingPoint<float> *this,FloatingPoint<float> *rhs)

{
  Bits BVar1;
  
  if ((~(this->u_).bits_ & 0x7f800000) != 0 || ((this->u_).bits_ & 0x7fffff) == 0) {
    if ((~(rhs->u_).bits_ & 0x7f800000) != 0 || ((rhs->u_).bits_ & 0x7fffff) == 0) {
      BVar1 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)this,(Bits *)rhs);
      return BVar1 < 5;
    }
  }
  return false;
}

Assistant:

Bits exponent_bits() const { return kExponentBitMask & u_.bits_; }